

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

bool __thiscall FIX::Session::shouldSendReset(Session *this)

{
  pointer pcVar1;
  int iVar2;
  SEQNUM SVar3;
  bool bVar4;
  string beginString;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string._M_dataplus.
           _M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,
             pcVar1 + (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_38);
  if ((-1 < iVar2) &&
     (((this->m_resetOnLogon != false || (this->m_resetOnLogout != false)) ||
      (this->m_resetOnDisconnect == true)))) {
    SVar3 = SessionState::getNextSenderMsgSeqNum(&this->m_state);
    if (SVar3 == 1) {
      SVar3 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
      bVar4 = SVar3 == 1;
      goto LAB_001ac201;
    }
  }
  bVar4 = false;
LAB_001ac201:
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return bVar4;
}

Assistant:

bool Session::shouldSendReset() {
  std::string beginString = m_sessionID.getBeginString();
  return beginString >= FIX::BeginString_FIX41 && (m_resetOnLogon || m_resetOnLogout || m_resetOnDisconnect)
         && (getExpectedSenderNum() == 1) && (getExpectedTargetNum() == 1);
}